

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O1

void do_compare(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  OBJ_DATA *arg1_00;
  OBJ_DATA *obj;
  int iVar5;
  char arg2 [4608];
  char arg1 [4608];
  char local_2418 [4608];
  char local_1218 [4608];
  
  pcVar4 = one_argument(argument,local_1218);
  one_argument(pcVar4,local_2418);
  if (local_1218[0] == '\0') {
    pcVar4 = "Compare what to what?\n\r";
  }
  else {
    arg1_00 = get_obj_carry(ch,local_1218,ch);
    if (arg1_00 != (OBJ_DATA *)0x0) {
      if (local_2418[0] == '\0') {
        for (obj = ch->carrying; obj != (OBJ_DATA *)0x0; obj = obj->next_content) {
          if (((obj->wear_loc != -1) && (bVar2 = can_see_obj(ch,obj), bVar2)) &&
             (arg1_00->item_type == obj->item_type)) {
            if ((arg1_00->wear_flags[0] == obj->wear_flags[0]) &&
               (((uint)arg1_00->wear_flags[0] & (uint)obj->wear_flags[0] & 1) != 0))
            goto LAB_00251a53;
          }
        }
        pcVar4 = "You aren\'t wearing anything comparable.\n\r";
        goto LAB_00251b3d;
      }
      obj = get_obj_carry(ch,local_2418,ch);
      if (obj != (OBJ_DATA *)0x0) {
LAB_00251a53:
        if (arg1_00 == obj) {
          pcVar4 = "You compare $p to itself.  It looks about the same.";
        }
        else {
          sVar1 = arg1_00->item_type;
          pcVar4 = "You can\'t compare $p and $P.";
          if (sVar1 == obj->item_type) {
            if (sVar1 == 5) {
              iVar3 = (arg1_00->value[2] + 1) * arg1_00->value[1];
              iVar5 = (obj->value[2] + 1) * obj->value[1];
            }
            else {
              bVar2 = false;
              iVar3 = 0;
              iVar5 = 0;
              if (sVar1 != 9) goto LAB_00251b87;
              iVar3 = arg1_00->value[1] + arg1_00->value[0] + arg1_00->value[2];
              iVar5 = obj->value[1] + obj->value[0] + obj->value[2];
            }
            bVar2 = true;
            pcVar4 = (char *)0x0;
            goto LAB_00251b87;
          }
        }
        bVar2 = false;
        iVar3 = 0;
        iVar5 = 0;
LAB_00251b87:
        if (bVar2) {
          if (iVar3 == iVar5) {
            pcVar4 = "$p and $P look about the same.";
          }
          else {
            pcVar4 = "$p looks worse than $P.";
            if (iVar5 < iVar3) {
              pcVar4 = "$p looks better than $P.";
            }
          }
        }
        act(pcVar4,ch,arg1_00,obj,3);
        return;
      }
    }
    pcVar4 = "You do not have that item.\n\r";
  }
LAB_00251b3d:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_compare(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Compare what to what?\n\r", ch);
		return;
	}

	auto obj1 = get_obj_carry(ch, arg1, ch);
	if (obj1 == nullptr)
	{
		send_to_char("You do not have that item.\n\r", ch);
		return;
	}

	OBJ_DATA *obj2;
	if (arg2[0] == '\0')
	{
		for (obj2 = ch->carrying; obj2 != nullptr; obj2 = obj2->next_content)
		{
			if (obj2->wear_loc != WEAR_NONE 
				&& can_see_obj(ch, obj2) 
				&& obj1->item_type == obj2->item_type 
				&& obj1->wear_flags[0] == obj2->wear_flags[0]
				&& IS_SET(obj1->wear_flags, ITEM_TAKE)
				&& IS_SET(obj2->wear_flags, ITEM_TAKE))
			{
				break;
			}
		}

		if (obj2 == nullptr)
		{
			send_to_char("You aren't wearing anything comparable.\n\r", ch);
			return;
		}
	}
	else
	{
		obj2 = get_obj_carry(ch, arg2, ch);
		if (obj2 == nullptr)
		{
			send_to_char("You do not have that item.\n\r", ch);
			return;
		}
	}

	char *msg = nullptr;
	auto value1 = 0;
	auto value2 = 0;

	if (obj1 == obj2)
	{
		msg = "You compare $p to itself.  It looks about the same.";
	}
	else if (obj1->item_type != obj2->item_type)
	{
		msg = "You can't compare $p and $P.";
	}
	else
	{
		switch (obj1->item_type)
		{
			case ITEM_ARMOR:
				value1 = obj1->value[0] + obj1->value[1] + obj1->value[2];
				value2 = obj2->value[0] + obj2->value[1] + obj2->value[2];
				break;
			case ITEM_WEAPON:
				value1 = (1 + obj1->value[2]) * obj1->value[1];
				value2 = (1 + obj2->value[2]) * obj2->value[1];
				break;
			default:
				msg = "You can't compare $p and $P.";
				break;
		}
	}

	if (msg == nullptr)
	{
		if (value1 == value2)
			msg = "$p and $P look about the same.";
		else if (value1 > value2)
			msg = "$p looks better than $P.";
		else
			msg = "$p looks worse than $P.";
	}

	act(msg, ch, obj1, obj2, TO_CHAR);
}